

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

ProfileKind llvm::ARM::parseArchProfile(StringRef Arch)

{
  ArchKind AVar1;
  size_t in_RDX;
  StringRef SVar2;
  StringRef Arch_local;
  ProfileKind local_c;
  
  SVar2.Data = (char *)Arch.Length;
  SVar2.Length = in_RDX;
  SVar2 = getCanonicalArchName((ARM *)Arch.Data,SVar2);
  AVar1 = parseArch(SVar2);
  switch(AVar1) {
  case INVALID:
  case ARMV2:
  case ARMV2A:
  case ARMV3:
  case ARMV3M:
  case ARMV4:
  case ARMV4T:
  case ARMV5T:
  case ARMV5TE:
  case ARMV5TEJ:
  case ARMV6:
  case ARMV6K:
  case ARMV6T2:
  case ARMV6KZ:
  case IWMMXT:
  case IWMMXT2:
  case XSCALE:
  case ARMV7S:
    local_c = INVALID;
    break;
  case ARMV6M:
  case ARMV7M:
  case ARMV7EM:
  case ARMV8MBaseline:
  case ARMV8MMainline:
    local_c = M;
    break;
  case ARMV7A:
  case ARMV7VE:
  case ARMV8A:
  case ARMV8_1A:
  case ARMV8_2A:
  case ARMV8_3A:
  case ARMV8_4A:
  case ARMV7K:
    local_c = A;
    break;
  case ARMV7R:
  case ARMV8R:
    local_c = R;
    break;
  default:
    llvm_unreachable_internal
              ("Unhandled architecture",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/TargetParser.cpp"
               ,0x317);
  }
  return local_c;
}

Assistant:

ARM::ProfileKind ARM::parseArchProfile(StringRef Arch) {
  Arch = getCanonicalArchName(Arch);
  switch (parseArch(Arch)) {
  case ARM::ArchKind::ARMV6M:
  case ARM::ArchKind::ARMV7M:
  case ARM::ArchKind::ARMV7EM:
  case ARM::ArchKind::ARMV8MMainline:
  case ARM::ArchKind::ARMV8MBaseline:
    return ARM::ProfileKind::M;
  case ARM::ArchKind::ARMV7R:
  case ARM::ArchKind::ARMV8R:
    return ARM::ProfileKind::R;
  case ARM::ArchKind::ARMV7A:
  case ARM::ArchKind::ARMV7VE:
  case ARM::ArchKind::ARMV7K:
  case ARM::ArchKind::ARMV8A:
  case ARM::ArchKind::ARMV8_1A:
  case ARM::ArchKind::ARMV8_2A:
  case ARM::ArchKind::ARMV8_3A:
  case ARM::ArchKind::ARMV8_4A:
    return ARM::ProfileKind::A;
  case ARM::ArchKind::ARMV2:
  case ARM::ArchKind::ARMV2A:
  case ARM::ArchKind::ARMV3:
  case ARM::ArchKind::ARMV3M:
  case ARM::ArchKind::ARMV4:
  case ARM::ArchKind::ARMV4T:
  case ARM::ArchKind::ARMV5T:
  case ARM::ArchKind::ARMV5TE:
  case ARM::ArchKind::ARMV5TEJ:
  case ARM::ArchKind::ARMV6:
  case ARM::ArchKind::ARMV6K:
  case ARM::ArchKind::ARMV6T2:
  case ARM::ArchKind::ARMV6KZ:
  case ARM::ArchKind::ARMV7S:
  case ARM::ArchKind::IWMMXT:
  case ARM::ArchKind::IWMMXT2:
  case ARM::ArchKind::XSCALE:
  case ARM::ArchKind::INVALID:
    return ARM::ProfileKind::INVALID;
  }
  llvm_unreachable("Unhandled architecture");
}